

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

result_t * sequenceWrapper(result_t *__return_storage_ptr__,string *s,shared_ptr<Env> *envptr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  SpadeArguments *__p;
  Env *env_00;
  shared_ptr<SpadeArguments> args;
  args_t args_;
  Env env;
  new_allocator<SpadeArguments> local_629;
  shared_ptr<SpadeArguments> local_628;
  undefined1 local_618 [16];
  undefined1 local_608 [376];
  ostringstream local_490 [112];
  ios_base local_420 [264];
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  parse((string *)local_618);
  Env::Env((Env *)local_608);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x140);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ca68;
  __p = (SpadeArguments *)(p_Var2 + 1);
  __gnu_cxx::new_allocator<SpadeArguments>::construct<SpadeArguments>(&local_629,__p);
  local_628.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  local_628.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  SpadeArguments::parse_args(__p,local_618._0_4_,(char **)local_618._8_8_);
  peVar1 = (envptr->super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  env_00 = (Env *)local_608;
  if (peVar1 != (element_type *)0x0) {
    env_00 = peVar1;
  }
  sequenceFunc(__return_storage_ptr__,env_00,&local_628);
  if (local_628.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_628.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::ios_base::~ios_base(local_2a8);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::ios_base::~ios_base((ios_base *)(local_608 + 0x70));
  args_t::~args_t((args_t *)local_618);
  return __return_storage_ptr__;
}

Assistant:

result_t sequenceWrapper(const string &s, shared_ptr<Env>& envptr) {
    args_t args_ = parse(s);
    Env env;
    shared_ptr<SpadeArguments> args = make_shared<SpadeArguments>();
    args->parse_args(args_.argc, args_.argv);
    if (envptr == nullptr) {
        return sequenceFunc(env, args);
    } else {
        return sequenceFunc(*envptr, args);
    }
}